

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<float>>>
               (SquareMatrix<std::complex<float>_> *mat)

{
  complex<float> val;
  ulong uVar1;
  ulong uVar2;
  
  if (mat->size_ != 0) {
    uVar2 = 0;
    val._M_value = (_ComplexT)mat;
    do {
      if (mat->size_ != 0) {
        uVar1 = 0;
        do {
          print<float>(val);
          uVar1 = uVar1 + 1;
        } while (uVar1 < (ulong)mat->size_);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      val._M_value = std::ostream::put('\b');
      std::ostream::flush();
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)mat->size_);
  }
  return;
}

Assistant:

void printMatrix( const T& mat ) {
   for ( size_t r = 0; r < mat.rows(); ++r ) {
     for ( size_t c = 0; c < mat.cols(); ++c ) {
       print( mat(r,c) ) ;
     }
     std::cout << std::endl ;
   }
 }